

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-data.hpp
# Opt level: O0

SmallBuffer * __thiscall
helics::NullTranslatorOperator::convertToValue
          (NullTranslatorOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *param_2)

{
  SmallBuffer *in_RDI;
  
  SmallBuffer::SmallBuffer(in_RDI);
  return in_RDI;
}

Assistant:

virtual SmallBuffer convertToValue(std::unique_ptr<Message> /*message*/) override { return {}; }